

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O3

QToolBarItem * __thiscall QToolBarLayout::createItem(QToolBarLayout *this,QAction *action)

{
  bool bVar1;
  char cVar2;
  ToolButtonStyle style;
  QWidget *parent;
  QWidgetAction *this_00;
  QWidget *this_01;
  QToolBarItem *this_02;
  bool bVar3;
  long in_FS_OFFSET;
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QSize local_48;
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QLayout::parentWidget(&this->super_QLayout);
  parent = (QWidget *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
  if (parent == (QWidget *)0x0) {
    this_02 = (QToolBarItem *)0x0;
    goto LAB_004b57d3;
  }
  this_00 = (QWidgetAction *)QMetaObject::cast((QObject *)&QWidgetAction::staticMetaObject);
  if (this_00 == (QWidgetAction *)0x0) {
    cVar2 = QAction::isSeparator();
    if (cVar2 == '\0') goto LAB_004b5695;
    this_01 = (QWidget *)operator_new(0x30);
    QToolBarSeparator::QToolBarSeparator((QToolBarSeparator *)this_01,(QToolBar *)parent);
    bVar1 = false;
    QObject::connect(local_40,(char *)parent,(QObject *)"2orientationChanged(Qt::Orientation)",
                     (char *)this_01,0x6e1f14);
    QMetaObject::Connection::~Connection((Connection *)local_40);
    bVar3 = false;
  }
  else {
    this_01 = QWidgetAction::requestWidget(this_00,parent);
    if (this_01 == (QWidget *)0x0) {
LAB_004b5695:
      this_01 = (QWidget *)operator_new(0x28);
      QToolButton::QToolButton((QToolButton *)this_01,parent);
      QToolButton::setAutoRaise((QToolButton *)this_01,true);
      bVar3 = false;
      QWidget::setFocusPolicy(this_01,NoFocus);
      local_48 = QToolBar::iconSize((QToolBar *)parent);
      QAbstractButton::setIconSize((QAbstractButton *)this_01,&local_48);
      style = QToolBar::toolButtonStyle((QToolBar *)parent);
      QToolButton::setToolButtonStyle((QToolButton *)this_01,style);
      QObject::connect(local_50,(char *)parent,(QObject *)"2iconSizeChanged(QSize)",(char *)this_01,
                       0x6e1f82);
      QMetaObject::Connection::~Connection((Connection *)local_50);
      QObject::connect(local_58,(char *)parent,
                       (QObject *)"2toolButtonStyleChanged(Qt::ToolButtonStyle)",(char *)this_01,
                       0x6e1f96);
      QMetaObject::Connection::~Connection((Connection *)local_58);
      QToolButton::setDefaultAction((QToolButton *)this_01,action);
      QObject::connect(local_60,(char *)this_01,(QObject *)"2triggered(QAction*)",(char *)parent,
                       0x6e1fbf);
      QMetaObject::Connection::~Connection((Connection *)local_60);
      bVar1 = true;
    }
    else {
      QWidget::setAttribute(this_01,WA_LayoutUsesWidgetRect,true);
      bVar3 = true;
      bVar1 = false;
    }
  }
  QWidget::hide(this_01);
  this_02 = (QToolBarItem *)operator_new(0x28);
  (this_02->super_QWidgetItem).super_QLayoutItem.align.
  super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i = 0;
  (this_02->super_QWidgetItem).wid = this_01;
  (this_02->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem = (_func_int **)0x7fe000;
  this_02->action = (QAction *)0x0;
  this_02->customWidget = false;
  if (bVar1) {
    QLayoutItem::setAlignment((QLayoutItem *)this_02,(Alignment)0x8);
  }
  this_02->customWidget = bVar3;
  this_02->action = action;
LAB_004b57d3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this_02;
  }
  __stack_chk_fail();
}

Assistant:

QToolBarItem *QToolBarLayout::createItem(QAction *action)
{
    bool customWidget = false;
    bool standardButtonWidget = false;
    QWidget *widget = nullptr;
    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return (QToolBarItem *)nullptr;

    if (QWidgetAction *widgetAction = qobject_cast<QWidgetAction *>(action)) {
        widget = widgetAction->requestWidget(tb);
        if (widget != nullptr) {
            widget->setAttribute(Qt::WA_LayoutUsesWidgetRect);
            customWidget = true;
        }
    } else if (action->isSeparator()) {
        QToolBarSeparator *sep = new QToolBarSeparator(tb);
        connect(tb, SIGNAL(orientationChanged(Qt::Orientation)),
                sep, SLOT(setOrientation(Qt::Orientation)));
        widget = sep;
    }

    if (!widget) {
        QToolButton *button = new QToolButton(tb);
        button->setAutoRaise(true);
        button->setFocusPolicy(Qt::NoFocus);
        button->setIconSize(tb->iconSize());
        button->setToolButtonStyle(tb->toolButtonStyle());
        QObject::connect(tb, SIGNAL(iconSizeChanged(QSize)),
                         button, SLOT(setIconSize(QSize)));
        QObject::connect(tb, SIGNAL(toolButtonStyleChanged(Qt::ToolButtonStyle)),
                         button, SLOT(setToolButtonStyle(Qt::ToolButtonStyle)));
        button->setDefaultAction(action);
        QObject::connect(button, SIGNAL(triggered(QAction*)), tb, SIGNAL(actionTriggered(QAction*)));
        widget = button;
        standardButtonWidget = true;
    }

    widget->hide();
    QToolBarItem *result = new QToolBarItem(widget);
    if (standardButtonWidget)
        result->setAlignment(Qt::AlignJustify);
    result->customWidget = customWidget;
    result->action = action;
    return result;
}